

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

DataStream * __thiscall
DataStream::operator<<(DataStream *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *obj)

{
  DataStream *in_RDI;
  long in_FS_OFFSET;
  DataStream *os;
  
  os = *(DataStream **)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
            (os,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  if (*(DataStream **)(in_FS_OFFSET + 0x28) == os) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

DataStream& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return (*this);
    }